

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImgDisplay * __thiscall cimg_library::CImgDisplay::set_key(CImgDisplay *this)

{
  int iVar1;
  
  memset(this->_keys,0,0x200);
  memset(this->_released_keys,0,0x200);
  this->_is_keyESC = false;
  this->_is_keyF1 = false;
  this->_is_keyF2 = false;
  this->_is_keyF3 = false;
  this->_is_keyF4 = false;
  this->_is_keyF5 = false;
  this->_is_keyF6 = false;
  this->_is_keyF7 = false;
  this->_is_keyF8 = false;
  this->_is_keyF9 = false;
  this->_is_keyF10 = false;
  this->_is_keyF11 = false;
  this->_is_keyF12 = false;
  this->_is_keyPAUSE = false;
  this->_is_key1 = false;
  this->_is_key2 = false;
  this->_is_key3 = false;
  this->_is_key4 = false;
  this->_is_key5 = false;
  this->_is_key6 = false;
  this->_is_key7 = false;
  this->_is_key8 = false;
  this->_is_key9 = false;
  this->_is_key0 = false;
  this->_is_keyBACKSPACE = false;
  this->_is_keyINSERT = false;
  this->_is_keyHOME = false;
  this->_is_keyPAGEUP = false;
  this->_is_keyTAB = false;
  this->_is_keyQ = false;
  this->_is_keyW = false;
  this->_is_keyE = false;
  this->_is_keyR = false;
  this->_is_keyT = false;
  this->_is_keyY = false;
  this->_is_keyU = false;
  this->_is_keyI = false;
  this->_is_keyO = false;
  this->_is_keyP = false;
  this->_is_keyDELETE = false;
  this->_is_keyEND = false;
  this->_is_keyPAGEDOWN = false;
  this->_is_keyCAPSLOCK = false;
  this->_is_keyA = false;
  this->_is_keyS = false;
  this->_is_keyD = false;
  this->_is_keyF = false;
  this->_is_keyG = false;
  this->_is_keyH = false;
  this->_is_keyJ = false;
  this->_is_keyK = false;
  this->_is_keyL = false;
  this->_is_keyENTER = false;
  this->_is_keySHIFTLEFT = false;
  this->_is_keyZ = false;
  this->_is_keyX = false;
  this->_is_keyC = false;
  this->_is_keyV = false;
  this->_is_keyB = false;
  this->_is_keyN = false;
  this->_is_keyM = false;
  this->_is_keySHIFTRIGHT = false;
  this->_is_keyARROWUP = false;
  this->_is_keyCTRLLEFT = false;
  this->_is_keyAPPLEFT = false;
  this->_is_keyALT = false;
  this->_is_keySPACE = false;
  this->_is_keyALTGR = false;
  this->_is_keyAPPRIGHT = false;
  this->_is_keyMENU = false;
  this->_is_keyCTRLRIGHT = false;
  this->_is_keyARROWLEFT = false;
  this->_is_keyARROWDOWN = false;
  this->_is_keyARROWRIGHT = false;
  this->_is_keyPAD0 = false;
  this->_is_keyPAD1 = false;
  this->_is_keyPAD2 = false;
  this->_is_keyPAD3 = false;
  this->_is_keyPAD4 = false;
  this->_is_keyPAD5 = false;
  this->_is_keyPAD6 = false;
  this->_is_keyPAD7 = false;
  this->_is_keyPAD8 = false;
  this->_is_keyPAD9 = false;
  this->_is_keyPADADD = false;
  this->_is_keyPADSUB = false;
  this->_is_keyPADMUL = false;
  this->_is_keyPADDIV = false;
  this->_is_event = true;
  if (cimg::X11_attr()::val == '\0') {
    iVar1 = __cxa_guard_acquire(&cimg::X11_attr()::val);
    if (iVar1 != 0) {
      cimg::X11_static::X11_static(&cimg::X11_attr::val);
      __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
      __cxa_guard_release(&cimg::X11_attr()::val);
    }
  }
  pthread_cond_broadcast((pthread_cond_t *)&cimg::X11_attr::val.wait_event);
  return this;
}

Assistant:

CImgDisplay& set_key() {
      std::memset((void*)_keys,0,128*sizeof(unsigned int));
      std::memset((void*)_released_keys,0,128*sizeof(unsigned int));
      _is_keyESC = _is_keyF1 = _is_keyF2 = _is_keyF3 = _is_keyF4 = _is_keyF5 = _is_keyF6 = _is_keyF7 = _is_keyF8 =
        _is_keyF9 = _is_keyF10 = _is_keyF11 = _is_keyF12 = _is_keyPAUSE = _is_key1 = _is_key2 = _is_key3 = _is_key4 =
        _is_key5 = _is_key6 = _is_key7 = _is_key8 = _is_key9 = _is_key0 = _is_keyBACKSPACE = _is_keyINSERT =
        _is_keyHOME = _is_keyPAGEUP = _is_keyTAB = _is_keyQ = _is_keyW = _is_keyE = _is_keyR = _is_keyT = _is_keyY =
        _is_keyU = _is_keyI = _is_keyO = _is_keyP = _is_keyDELETE = _is_keyEND = _is_keyPAGEDOWN = _is_keyCAPSLOCK =
        _is_keyA = _is_keyS = _is_keyD = _is_keyF = _is_keyG = _is_keyH = _is_keyJ = _is_keyK = _is_keyL =
        _is_keyENTER = _is_keySHIFTLEFT = _is_keyZ = _is_keyX = _is_keyC = _is_keyV = _is_keyB = _is_keyN =
        _is_keyM = _is_keySHIFTRIGHT = _is_keyARROWUP = _is_keyCTRLLEFT = _is_keyAPPLEFT = _is_keyALT = _is_keySPACE =
        _is_keyALTGR = _is_keyAPPRIGHT = _is_keyMENU = _is_keyCTRLRIGHT = _is_keyARROWLEFT = _is_keyARROWDOWN =
        _is_keyARROWRIGHT = _is_keyPAD0 = _is_keyPAD1 = _is_keyPAD2 = _is_keyPAD3 = _is_keyPAD4 = _is_keyPAD5 =
        _is_keyPAD6 = _is_keyPAD7 = _is_keyPAD8 = _is_keyPAD9 = _is_keyPADADD = _is_keyPADSUB = _is_keyPADMUL =
        _is_keyPADDIV = false;
      _is_event = true;
#if cimg_display==1
      pthread_cond_broadcast(&cimg::X11_attr().wait_event);
#elif cimg_display==2
      SetEvent(cimg::Win32_attr().wait_event);
#endif
      return *this;
    }